

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

OPJ_BOOL opj_tcd_dwt_decode(opj_tcd_t *p_tcd)

{
  opj_tcd_tile_t *poVar1;
  OPJ_BOOL OVar2;
  opj_image_comp_t *local_40;
  opj_image_comp_t *l_img_comp;
  opj_tccp_t *l_tccp;
  opj_tcd_tilecomp_t *l_tile_comp;
  opj_tcd_tile_t *l_tile;
  OPJ_UINT32 compno;
  opj_tcd_t *p_tcd_local;
  
  poVar1 = p_tcd->tcd_image->tiles;
  l_tccp = (opj_tccp_t *)poVar1->comps;
  l_img_comp = (opj_image_comp_t *)p_tcd->tcp->tccps;
  local_40 = p_tcd->image->comps;
  l_tile._4_4_ = 0;
  do {
    if (poVar1->numcomps <= l_tile._4_4_) {
      return 1;
    }
    if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[l_tile._4_4_] != 0)) {
      if (l_img_comp->y0 == 1) {
        OVar2 = opj_dwt_decode(p_tcd,(opj_tcd_tilecomp_t *)l_tccp,local_40->resno_decoded + 1);
        if (OVar2 == 0) {
          return 0;
        }
      }
      else {
        OVar2 = opj_dwt_decode_real(p_tcd,(opj_tcd_tilecomp_t *)l_tccp,local_40->resno_decoded + 1);
        if (OVar2 == 0) {
          return 0;
        }
      }
    }
    l_tile._4_4_ = l_tile._4_4_ + 1;
    l_tccp = (opj_tccp_t *)&l_tccp->stepsizes[10].mant;
    local_40 = local_40 + 1;
    l_img_comp = (opj_image_comp_t *)&l_img_comp[0x10].alpha;
  } while( true );
}

Assistant:

static OPJ_BOOL opj_tcd_dwt_decode(opj_tcd_t *p_tcd)
{
    OPJ_UINT32 compno;
    opj_tcd_tile_t * l_tile = p_tcd->tcd_image->tiles;
    opj_tcd_tilecomp_t * l_tile_comp = l_tile->comps;
    opj_tccp_t * l_tccp = p_tcd->tcp->tccps;
    opj_image_comp_t * l_img_comp = p_tcd->image->comps;

    for (compno = 0; compno < l_tile->numcomps;
            compno++, ++l_tile_comp, ++l_img_comp, ++l_tccp) {
        if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
            continue;
        }

        if (l_tccp->qmfbid == 1) {
            if (! opj_dwt_decode(p_tcd, l_tile_comp,
                                 l_img_comp->resno_decoded + 1)) {
                return OPJ_FALSE;
            }
        } else {
            if (! opj_dwt_decode_real(p_tcd, l_tile_comp,
                                      l_img_comp->resno_decoded + 1)) {
                return OPJ_FALSE;
            }
        }

    }

    return OPJ_TRUE;
}